

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

bool __thiscall tinyusdz::Attribute::is_value(Attribute *this)

{
  bool bVar1;
  
  bVar1 = is_connection(this);
  if ((!bVar1) && (bVar1 = is_timesamples(this), !bVar1)) {
    bVar1 = is_blocked(this);
    return !bVar1;
  }
  return false;
}

Assistant:

bool is_value() const {
    if (is_connection()) {
      return false;
    }

    if (is_timesamples()) {
      return false;
    }

    if (is_blocked()) {
      return false;
    }

    return true;
  }